

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O2

void r_from_k(secp256k1_scalar *r,secp256k1_ge *group,int k,int *overflow)

{
  uint64_t *puVar1;
  int iVar2;
  uchar x_bin [32];
  secp256k1_fe x;
  
  iVar2 = k % 0xd;
  x.n[0] = group[iVar2].x.n[0];
  x.n[1] = group[iVar2].x.n[1];
  puVar1 = group[iVar2].x.n + 2;
  x.n[2] = *puVar1;
  x.n[3] = puVar1[1];
  puVar1 = group[iVar2].x.n + 4;
  x.n[4] = *puVar1;
  x._40_8_ = puVar1[1];
  secp256k1_fe_normalize(&x);
  secp256k1_fe_get_b32(x_bin,&x);
  secp256k1_scalar_set_b32(r,x_bin,(int *)0x0);
  return;
}

Assistant:

static void r_from_k(secp256k1_scalar *r, const secp256k1_ge *group, int k, int* overflow) {
    secp256k1_fe x;
    unsigned char x_bin[32];
    k %= EXHAUSTIVE_TEST_ORDER;
    x = group[k].x;
    secp256k1_fe_normalize(&x);
    secp256k1_fe_get_b32(x_bin, &x);
    secp256k1_scalar_set_b32(r, x_bin, overflow);
}